

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha_blocks_ref.c
# Opt level: O0

void chacha_blocks_ref(chacha_state_conflict *state,uint8_t *in,uint8_t *out,size_t bytes)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  ulong in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  size_t r;
  size_t i;
  uint8_t tmp [64];
  uint8_t *ctarget;
  uint32_t t;
  uint32_t j [12];
  uint32_t x [16];
  ulong local_f0;
  uint8_t local_e8 [64];
  uint8_t *local_a8;
  uint local_9c;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  ulong local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_a8 = (uint8_t *)CONCAT71(in_register_00000011,in_DL);
  if (in_RCX != 0) {
    local_20 = in_RCX;
    local_18 = local_a8;
    local_10 = in_RSI;
    local_8 = in_RDI;
    local_98 = U8TO32(in_RDI);
    local_94 = U8TO32(local_8 + 4);
    local_90 = U8TO32(local_8 + 8);
    local_8c = U8TO32(local_8 + 0xc);
    local_88 = U8TO32(local_8 + 0x10);
    local_84 = U8TO32(local_8 + 0x14);
    local_80 = U8TO32(local_8 + 0x18);
    local_7c = U8TO32(local_8 + 0x1c);
    local_78 = U8TO32(local_8 + 0x20);
    local_74 = U8TO32(local_8 + 0x24);
    local_70 = U8TO32(local_8 + 0x28);
    local_6c = U8TO32(local_8 + 0x2c);
    lVar1 = *(long *)(local_8 + 0x30);
    while( true ) {
      if (local_20 < 0x40) {
        if (local_10 != (uint8_t *)0x0) {
          for (local_f0 = 0; local_f0 < local_20; local_f0 = local_f0 + 1) {
            local_e8[local_f0] = local_10[local_f0];
          }
          local_10 = local_e8;
        }
        local_a8 = local_18;
        local_18 = local_e8;
      }
      local_68 = 0x61707865;
      local_64 = 0x3320646e;
      local_60 = 0x79622d32;
      local_5c = 0x6b206574;
      local_58 = local_98;
      local_54 = local_94;
      local_50 = local_90;
      local_4c = local_8c;
      local_48 = local_88;
      local_44 = local_84;
      local_40 = local_80;
      local_3c = local_7c;
      local_38 = local_78;
      local_34 = local_74;
      local_30 = local_70;
      local_2c = local_6c;
      local_f0 = lVar1;
      do {
        local_68 = local_58 + local_68;
        local_9c = local_38 ^ local_68;
        local_38 = ROTL32(local_9c,0x10);
        local_48 = local_38 + local_48;
        local_9c = local_58 ^ local_48;
        local_58 = ROTL32(local_9c,0xc);
        local_68 = local_58 + local_68;
        local_9c = local_38 ^ local_68;
        local_38 = ROTL32(local_9c,8);
        local_48 = local_38 + local_48;
        local_9c = local_58 ^ local_48;
        local_58 = ROTL32(local_9c,7);
        local_64 = local_54 + local_64;
        local_9c = local_34 ^ local_64;
        local_34 = ROTL32(local_9c,0x10);
        local_44 = local_34 + local_44;
        local_9c = local_54 ^ local_44;
        local_54 = ROTL32(local_9c,0xc);
        local_64 = local_54 + local_64;
        local_9c = local_34 ^ local_64;
        local_34 = ROTL32(local_9c,8);
        local_44 = local_34 + local_44;
        local_9c = local_54 ^ local_44;
        local_54 = ROTL32(local_9c,7);
        local_60 = local_50 + local_60;
        local_9c = local_30 ^ local_60;
        local_30 = ROTL32(local_9c,0x10);
        local_40 = local_30 + local_40;
        local_9c = local_50 ^ local_40;
        local_50 = ROTL32(local_9c,0xc);
        local_60 = local_50 + local_60;
        local_9c = local_30 ^ local_60;
        local_30 = ROTL32(local_9c,8);
        local_40 = local_30 + local_40;
        local_9c = local_50 ^ local_40;
        local_50 = ROTL32(local_9c,7);
        local_5c = local_4c + local_5c;
        local_9c = local_2c ^ local_5c;
        local_2c = ROTL32(local_9c,0x10);
        local_3c = local_2c + local_3c;
        local_9c = local_4c ^ local_3c;
        local_4c = ROTL32(local_9c,0xc);
        local_5c = local_4c + local_5c;
        local_9c = local_2c ^ local_5c;
        local_2c = ROTL32(local_9c,8);
        local_3c = local_2c + local_3c;
        local_9c = local_4c ^ local_3c;
        local_4c = ROTL32(local_9c,7);
        local_68 = local_54 + local_68;
        local_9c = local_2c ^ local_68;
        local_2c = ROTL32(local_9c,0x10);
        local_40 = local_2c + local_40;
        local_9c = local_54 ^ local_40;
        local_54 = ROTL32(local_9c,0xc);
        local_68 = local_54 + local_68;
        local_9c = local_2c ^ local_68;
        local_2c = ROTL32(local_9c,8);
        local_40 = local_2c + local_40;
        local_9c = local_54 ^ local_40;
        local_54 = ROTL32(local_9c,7);
        local_64 = local_50 + local_64;
        local_9c = local_38 ^ local_64;
        local_38 = ROTL32(local_9c,0x10);
        local_3c = local_38 + local_3c;
        local_9c = local_50 ^ local_3c;
        local_50 = ROTL32(local_9c,0xc);
        local_64 = local_50 + local_64;
        local_9c = local_38 ^ local_64;
        local_38 = ROTL32(local_9c,8);
        local_3c = local_38 + local_3c;
        local_9c = local_50 ^ local_3c;
        local_50 = ROTL32(local_9c,7);
        local_60 = local_4c + local_60;
        local_9c = local_34 ^ local_60;
        local_34 = ROTL32(local_9c,0x10);
        local_48 = local_34 + local_48;
        local_9c = local_4c ^ local_48;
        local_4c = ROTL32(local_9c,0xc);
        local_60 = local_4c + local_60;
        local_9c = local_34 ^ local_60;
        local_34 = ROTL32(local_9c,8);
        local_48 = local_34 + local_48;
        local_9c = local_4c ^ local_48;
        local_4c = ROTL32(local_9c,7);
        local_5c = local_58 + local_5c;
        local_9c = local_30 ^ local_5c;
        local_30 = ROTL32(local_9c,0x10);
        local_44 = local_30 + local_44;
        local_9c = local_58 ^ local_44;
        local_58 = ROTL32(local_9c,0xc);
        local_5c = local_58 + local_5c;
        local_9c = local_30 ^ local_5c;
        local_30 = ROTL32(local_9c,8);
        local_44 = local_30 + local_44;
        local_9c = local_58 ^ local_44;
        local_58 = ROTL32(local_9c,7);
        puVar5 = local_18;
        local_f0 = local_f0 + -2;
      } while (local_f0 != 0);
      uVar2 = local_68 + 0x61707865;
      local_64 = local_64 + 0x3320646e;
      local_60 = local_60 + 0x79622d32;
      local_5c = local_5c + 0x6b206574;
      local_58 = local_98 + local_58;
      local_54 = local_94 + local_54;
      local_50 = local_90 + local_50;
      local_4c = local_8c + local_4c;
      local_48 = local_88 + local_48;
      local_44 = local_84 + local_44;
      local_40 = local_80 + local_40;
      local_3c = local_7c + local_3c;
      local_38 = local_78 + local_38;
      local_34 = local_74 + local_34;
      local_30 = local_70 + local_30;
      local_2c = local_6c + local_2c;
      local_68 = uVar2;
      if (local_10 == (uint8_t *)0x0) {
        U32TO8(local_18,uVar2);
        U32TO8(local_18 + 4,local_64);
        U32TO8(local_18 + 8,local_60);
        U32TO8(local_18 + 0xc,local_5c);
        U32TO8(local_18 + 0x10,local_58);
        U32TO8(local_18 + 0x14,local_54);
        U32TO8(local_18 + 0x18,local_50);
        U32TO8(local_18 + 0x1c,local_4c);
        U32TO8(local_18 + 0x20,local_48);
        U32TO8(local_18 + 0x24,local_44);
        U32TO8(local_18 + 0x28,local_40);
        U32TO8(local_18 + 0x2c,local_3c);
        U32TO8(local_18 + 0x30,local_38);
        U32TO8(local_18 + 0x34,local_34);
        U32TO8(local_18 + 0x38,local_30);
        U32TO8(local_18 + 0x3c,local_2c);
      }
      else {
        uVar3 = U8TO32(local_10);
        U32TO8(puVar5,uVar2 ^ uVar3);
        uVar2 = local_64;
        puVar5 = local_18 + 4;
        uVar3 = U8TO32(local_10 + 4);
        U32TO8(puVar5,uVar2 ^ uVar3);
        uVar2 = local_60;
        puVar5 = local_18 + 8;
        uVar3 = U8TO32(local_10 + 8);
        U32TO8(puVar5,uVar2 ^ uVar3);
        uVar2 = local_5c;
        puVar5 = local_18 + 0xc;
        uVar3 = U8TO32(local_10 + 0xc);
        U32TO8(puVar5,uVar2 ^ uVar3);
        uVar3 = local_58;
        puVar5 = local_18 + 0x10;
        uVar4 = U8TO32(local_10 + 0x10);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_54;
        puVar5 = local_18 + 0x14;
        uVar4 = U8TO32(local_10 + 0x14);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_50;
        puVar5 = local_18 + 0x18;
        uVar4 = U8TO32(local_10 + 0x18);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_4c;
        puVar5 = local_18 + 0x1c;
        uVar4 = U8TO32(local_10 + 0x1c);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_48;
        puVar5 = local_18 + 0x20;
        uVar4 = U8TO32(local_10 + 0x20);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_44;
        puVar5 = local_18 + 0x24;
        uVar4 = U8TO32(local_10 + 0x24);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_40;
        puVar5 = local_18 + 0x28;
        uVar4 = U8TO32(local_10 + 0x28);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_3c;
        puVar5 = local_18 + 0x2c;
        uVar4 = U8TO32(local_10 + 0x2c);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_38;
        puVar5 = local_18 + 0x30;
        uVar4 = U8TO32(local_10 + 0x30);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_34;
        puVar5 = local_18 + 0x34;
        uVar4 = U8TO32(local_10 + 0x34);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_30;
        puVar5 = local_18 + 0x38;
        uVar4 = U8TO32(local_10 + 0x38);
        U32TO8(puVar5,uVar3 ^ uVar4);
        uVar3 = local_2c;
        puVar5 = local_18 + 0x3c;
        uVar4 = U8TO32(local_10 + 0x3c);
        U32TO8(puVar5,uVar3 ^ uVar4);
        local_10 = local_10 + 0x40;
      }
      local_78 = local_78 + 1;
      if (local_78 == 0) {
        local_74 = local_74 + 1;
      }
      if (local_20 < 0x41) break;
      local_20 = local_20 - 0x40;
      local_18 = local_18 + 0x40;
    }
    if (local_20 < 0x40) {
      for (local_f0 = 0; local_f0 < local_20; local_f0 = local_f0 + 1) {
        local_a8[local_f0] = local_18[local_f0];
      }
    }
    U32TO8(local_8 + 0x20,local_78);
    U32TO8(local_8 + 0x24,local_74);
  }
  return;
}

Assistant:

void
chacha_blocks_ref(chacha_state *state, const uint8_t *in, uint8_t *out, size_t bytes) {
    uint32_t x[16], j[12];
    uint32_t t;
    uint8_t *ctarget = out, tmp[64];
    size_t i, r;

    if (!bytes) return;

    j[0] = U8TO32(state->s + 0);
    j[1] = U8TO32(state->s + 4);
    j[2] = U8TO32(state->s + 8);
    j[3] = U8TO32(state->s + 12);
    j[4] = U8TO32(state->s + 16);
    j[5] = U8TO32(state->s + 20);
    j[6] = U8TO32(state->s + 24);
    j[7] = U8TO32(state->s + 28);
    j[8] = U8TO32(state->s + 32);
    j[9] = U8TO32(state->s + 36);
    j[10] = U8TO32(state->s + 40);
    j[11] = U8TO32(state->s + 44);

    r = state->rounds;

    for (;;) {
        if (bytes < 64) {
            if (in) {
                for (i = 0; i < bytes; i++) tmp[i] = in[i];
                in = tmp;
            }
            ctarget = out;
            out = tmp;
        }

        x[0] = chacha_constants[0];
        x[1] = chacha_constants[1];
        x[2] = chacha_constants[2];
        x[3] = chacha_constants[3];
        x[4] = j[0];
        x[5] = j[1];
        x[6] = j[2];
        x[7] = j[3];
        x[8] = j[4];
        x[9] = j[5];
        x[10] = j[6];
        x[11] = j[7];
        x[12] = j[8];
        x[13] = j[9];
        x[14] = j[10];
        x[15] = j[11];

        #define quarter(a,b,c,d) \
            a += b; t = d^a; d = ROTL32(t,16); \
            c += d; t = b^c; b = ROTL32(t,12); \
            a += b; t = d^a; d = ROTL32(t, 8); \
            c += d; t = b^c; b = ROTL32(t, 7);

        #define doubleround() \
            quarter( x[0], x[4], x[8],x[12]) \
            quarter( x[1], x[5], x[9],x[13]) \
            quarter( x[2], x[6],x[10],x[14]) \
            quarter( x[3], x[7],x[11],x[15]) \
            quarter( x[0], x[5],x[10],x[15]) \
            quarter( x[1], x[6],x[11],x[12]) \
            quarter( x[2], x[7], x[8],x[13]) \
            quarter( x[3], x[4], x[9],x[14])

        i = r;
        do {
            doubleround()
            i -= 2;
        } while (i);

        x[0] += chacha_constants[0];
        x[1] += chacha_constants[1];
        x[2] += chacha_constants[2];
        x[3] += chacha_constants[3];
        x[4] += j[0];
        x[5] += j[1];
        x[6] += j[2];
        x[7] += j[3];
        x[8] += j[4];
        x[9] += j[5];
        x[10] += j[6];
        x[11] += j[7];
        x[12] += j[8];
        x[13] += j[9];
        x[14] += j[10];
        x[15] += j[11];

        if (in) {
            U32TO8(out +  0,  x[0] ^ U8TO32(in +  0));
            U32TO8(out +  4,  x[1] ^ U8TO32(in +  4));
            U32TO8(out +  8,  x[2] ^ U8TO32(in +  8));
            U32TO8(out + 12,  x[3] ^ U8TO32(in + 12));
            U32TO8(out + 16,  x[4] ^ U8TO32(in + 16));
            U32TO8(out + 20,  x[5] ^ U8TO32(in + 20));
            U32TO8(out + 24,  x[6] ^ U8TO32(in + 24));
            U32TO8(out + 28,  x[7] ^ U8TO32(in + 28));
            U32TO8(out + 32,  x[8] ^ U8TO32(in + 32));
            U32TO8(out + 36,  x[9] ^ U8TO32(in + 36));
            U32TO8(out + 40, x[10] ^ U8TO32(in + 40));
            U32TO8(out + 44, x[11] ^ U8TO32(in + 44));
            U32TO8(out + 48, x[12] ^ U8TO32(in + 48));
            U32TO8(out + 52, x[13] ^ U8TO32(in + 52));
            U32TO8(out + 56, x[14] ^ U8TO32(in + 56));
            U32TO8(out + 60, x[15] ^ U8TO32(in + 60));
            in += 64;
        } else {
            U32TO8(out +  0,  x[0]);
            U32TO8(out +  4,  x[1]);
            U32TO8(out +  8,  x[2]);
            U32TO8(out + 12,  x[3]);
            U32TO8(out + 16,  x[4]);
            U32TO8(out + 20,  x[5]);
            U32TO8(out + 24,  x[6]);
            U32TO8(out + 28,  x[7]);
            U32TO8(out + 32,  x[8]);
            U32TO8(out + 36,  x[9]);
            U32TO8(out + 40, x[10]);
            U32TO8(out + 44, x[11]);
            U32TO8(out + 48, x[12]);
            U32TO8(out + 52, x[13]);
            U32TO8(out + 56, x[14]);
            U32TO8(out + 60, x[15]);
        }

        /* increment the 64 bit counter, split in to two 32 bit halves */
        j[8]++;
        if (!j[8])
            j[9]++;

        if (bytes <= 64) {
            if (bytes < 64) for (i = 0; i < bytes; i++) ctarget[i] = out[i];

            /* store the counter back to the state */
            U32TO8(state->s + 32, j[8]);
            U32TO8(state->s + 36, j[9]);
            return;
        }
        bytes -= 64;
        out += 64;
    }
}